

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O0

BOOL find_dupname_details
               (PCRE2_SPTR16 name,uint32_t length,int *indexptr,int *countptr,int *errorcodeptr,
               compile_block_16 *cb)

{
  int iVar1;
  uint uVar2;
  uint local_5c;
  ushort *local_58;
  PCRE2_UCHAR16 *slot;
  int count;
  uint32_t groupnumber;
  uint32_t i;
  compile_block_16 *cb_local;
  int *errorcodeptr_local;
  int *countptr_local;
  int *indexptr_local;
  uint32_t length_local;
  PCRE2_SPTR16 name_local;
  
  local_58 = cb->name_table;
  count = 0;
  for (; ((uint)count < (uint)cb->names_found &&
         ((iVar1 = _pcre2_strncmp_16(name,local_58 + 1,(ulong)length), iVar1 != 0 ||
          (local_58[length + 1] != 0)))); local_58 = local_58 + (int)(uint)cb->name_entry_size) {
    count = count + 1;
  }
  if ((uint)count < (uint)cb->names_found) {
    *indexptr = count;
    slot._4_4_ = 0;
    while( true ) {
      slot._4_4_ = slot._4_4_ + 1;
      uVar2 = (uint)*local_58;
      if (uVar2 < 0x20) {
        local_5c = 1 << ((byte)*local_58 & 0x1f);
      }
      else {
        local_5c = 1;
      }
      cb->backref_map = local_5c | cb->backref_map;
      if (cb->top_backref < uVar2) {
        cb->top_backref = uVar2;
      }
      count = count + 1;
      if ((uint)cb->names_found <= (uint)count) break;
      local_58 = local_58 + (int)(uint)cb->name_entry_size;
      iVar1 = _pcre2_strncmp_16(name,local_58 + 1,(ulong)length);
      if ((iVar1 != 0) || (local_58[(ulong)length + 1] != 0)) break;
    }
    *countptr = slot._4_4_;
    name_local._4_4_ = 1;
  }
  else {
    *errorcodeptr = 0x99;
    cb->erroroffset = (long)name - (long)cb->start_pattern >> 1;
    name_local._4_4_ = 0;
  }
  return name_local._4_4_;
}

Assistant:

static BOOL
find_dupname_details(PCRE2_SPTR name, uint32_t length, int *indexptr,
  int *countptr, int *errorcodeptr, compile_block *cb)
{
uint32_t i, groupnumber;
int count;
PCRE2_UCHAR *slot = cb->name_table;

/* Find the first entry in the table */

for (i = 0; i < cb->names_found; i++)
  {
  if (PRIV(strncmp)(name, slot+IMM2_SIZE, length) == 0 &&
      slot[IMM2_SIZE+length] == 0) break;
  slot += cb->name_entry_size;
  }

/* This should not occur, because this function is called only when we know we
have duplicate names. Give an internal error. */

if (i >= cb->names_found)
  {
  *errorcodeptr = ERR53;
  cb->erroroffset = name - cb->start_pattern;
  return FALSE;
  }

/* Record the index and then see how many duplicates there are, updating the
backref map and maximum back reference as we do. */

*indexptr = i;
count = 0;

for (;;)
  {
  count++;
  groupnumber = GET2(slot,0);
  cb->backref_map |= (groupnumber < 32)? (1u << groupnumber) : 1;
  if (groupnumber > cb->top_backref) cb->top_backref = groupnumber;
  if (++i >= cb->names_found) break;
  slot += cb->name_entry_size;
  if (PRIV(strncmp)(name, slot+IMM2_SIZE, length) != 0 ||
    (slot+IMM2_SIZE)[length] != 0) break;
  }

*countptr = count;
return TRUE;
}